

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

int Vta_ManComputeDepthIncrease(Vta_Obj_t **pp1,Vta_Obj_t **pp2)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = *(uint *)&(*pp1)->field_0xc & 0xfffffff;
  uVar3 = *(uint *)&(*pp2)->field_0xc & 0xfffffff;
  uVar1 = 0xffffffff;
  if ((uVar3 <= uVar4) && (uVar1 = 1, uVar4 == uVar3)) {
    uVar1 = 0xffffffff;
    iVar2 = (int)((ulong)((long)*pp1 - (long)*pp2) >> 4);
    if (-1 < iVar2) {
      uVar1 = (uint)(iVar2 != 0);
    }
  }
  return uVar1;
}

Assistant:

int Vta_ManComputeDepthIncrease( Vta_Obj_t ** pp1, Vta_Obj_t ** pp2 )
{
    int Diff = (*pp1)->Prio - (*pp2)->Prio;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    Diff = (*pp1) - (*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}